

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O3

ecs_entity_t
ecs_lookup_path_w_sep(ecs_world_t *world,ecs_entity_t parent,char *path,char *sep,char *prefix)

{
  bool bVar1;
  char *pcVar2;
  ecs_entity_t parent_00;
  char *path_00;
  ecs_entity_t entity;
  char *sep_00;
  char buff [64];
  char *local_80;
  char local_78 [72];
  
  if (path == (char *)0x0) {
LAB_001147a0:
    parent_00 = 0;
  }
  else {
    local_80 = path;
    parent_00 = find_as_alias(world,path);
    if (parent_00 == 0) {
      sep_00 = ".";
      if (sep != (char *)0x0) {
        sep_00 = sep;
      }
      parent_00 = get_parent_from_path(world,parent,&local_80,prefix);
      pcVar2 = local_80;
      bVar1 = false;
      path_00 = pcVar2;
      entity = parent_00;
LAB_00114737:
      path_00 = path_elem(path_00,local_78,sep_00);
      if (path_00 != (char *)0x0) goto code_r0x0011474a;
      if (parent_00 == 0 && !bVar1) goto LAB_0011477a;
    }
  }
  return parent_00;
code_r0x0011474a:
  parent_00 = ecs_lookup_child(world,parent_00,local_78);
  if (parent_00 == 0) {
    if (!bVar1) {
LAB_0011477a:
      if (entity == 0) {
        bVar1 = true;
        parent_00 = 0x118;
        path_00 = pcVar2;
        entity = parent_00;
      }
      else {
        parent_00 = ecs_get_parent_w_entity(world,entity,0);
        path_00 = pcVar2;
        entity = parent_00;
      }
      goto LAB_00114737;
    }
    goto LAB_001147a0;
  }
  goto LAB_00114737;
}

Assistant:

ecs_entity_t ecs_lookup_path_w_sep(
    ecs_world_t *world,
    ecs_entity_t parent,
    const char *path,
    const char *sep,
    const char *prefix)
{
    if (!path) {
        return 0;
    }

    ecs_entity_t e = find_as_alias(world, path);
    if (e) {
        return e;
    }      
    
    char buff[ECS_MAX_NAME_LENGTH];
    const char *ptr;
    ecs_entity_t cur;
    bool core_searched = false;

    if (!sep) {
        sep = ".";
    }

    parent = get_parent_from_path(world, parent, &path, prefix);

retry:
    cur = parent;
    ptr = path;

    while ((ptr = path_elem(ptr, buff, sep))) {
        cur = ecs_lookup_child(world, cur, buff);
        if (!cur) {
            goto tail;
        }
    }

tail:
    if (!cur) {
        if (!core_searched) {
            if (parent) {
                parent = ecs_get_parent_w_entity(world, parent, 0);
            } else {
                parent = EcsFlecsCore;
                core_searched = true;
            }
            goto retry;
        }
    }

    return cur;
}